

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void sse::ConvertToRgb(uint8_t *outY,uint8_t *outYEnd,uint8_t *inY,uint32_t rowSizeOut,
                      uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,
                      uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 (*pauVar8) [16];
  uint8_t *puVar9;
  uint8_t *__s;
  ulong uVar10;
  
  if (outY != outYEnd) {
    puVar9 = inY + totalSimdWidth;
    do {
      auVar6 = _DAT_001db4f0;
      auVar5 = _DAT_001db4e0;
      auVar4 = _DAT_001db4d0;
      if (simdWidth != 0) {
        lVar7 = 0;
        pauVar8 = (undefined1 (*) [16])inY;
        do {
          auVar1 = *pauVar8;
          pauVar8 = pauVar8 + 1;
          auVar2 = vpshufb_avx(auVar1,auVar4);
          auVar3 = vpshufb_avx(auVar1,auVar5);
          auVar1 = vpshufb_avx(auVar1,auVar6);
          *(undefined1 (*) [16])(outY + lVar7) = auVar2;
          *(undefined1 (*) [16])(outY + lVar7 + 0x10) = auVar3;
          *(undefined1 (*) [16])(outY + lVar7 + 0x20) = auVar1;
          lVar7 = lVar7 + 0x30;
        } while ((ulong)simdWidth * 0x30 != lVar7);
      }
      if (nonSimdWidth != 0) {
        uVar10 = 0;
        __s = outY + totalSimdWidth * colorCount;
        do {
          memset(__s,(uint)puVar9[uVar10],(ulong)colorCount);
          __s = __s + colorCount;
          uVar10 = uVar10 + 1;
        } while (nonSimdWidth != uVar10);
      }
      outY = outY + rowSizeOut;
      inY = *(undefined1 (*) [16])inY + rowSizeIn;
      puVar9 = puVar9 + rowSizeIn;
    } while (outY != outYEnd);
  }
  return;
}

Assistant:

void ConvertToRgb( uint8_t * outY, const uint8_t * outYEnd, const uint8_t * inY, uint32_t rowSizeOut, uint32_t rowSizeIn,
                       uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl1 = _mm_setr_epi8( 0, 0, 0, 1, 1, 1, 2, 2, 2, 3, 3, 3, 4, 4, 4, 5 );
        const simd ctrl2 = _mm_setr_epi8( 5, 5, 6, 6, 6, 7, 7, 7, 8, 8, 8, 9, 9, 9, 10, 10 );
        const simd ctrl3 = _mm_setr_epi8( 10, 11, 11, 11, 12, 12, 12, 13, 13, 13, 14, 14, 14, 15, 15, 15 );
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const simd * src = reinterpret_cast<const simd*>(inY);
            simd       * dst = reinterpret_cast<simd*>(outY);

            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                const simd src1 = _mm_loadu_si128( src );

                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl1 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl2 ) );
                _mm_storeu_si128( dst++, _mm_shuffle_epi8( src1, ctrl3 ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * inX  = inY + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth*colorCount;

                const uint8_t * inXEnd = inX + nonSimdWidth;

                for( ; inX != inXEnd; outX += colorCount, ++inX )
                    memset( outX, (*inX), sizeof( uint8_t ) * colorCount );
            }
        }
    }